

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sisd_alignment_engine.cpp
# Opt level: O3

Alignment * __thiscall
spoa::SisdAlignmentEngine::Affine
          (Alignment *__return_storage_ptr__,SisdAlignmentEngine *this,uint32_t sequence_len,
          Graph *graph,int32_t *score)

{
  long lVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  pointer ppNVar5;
  Implementation *pIVar6;
  pointer ppEVar7;
  int32_t *piVar8;
  Node *pNVar9;
  pointer ppEVar10;
  ulong uVar11;
  pointer ppVar12;
  pointer ppEVar13;
  pointer ppVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  AlignmentType AVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *this_00;
  bool bVar34;
  bool bVar35;
  uint local_f0;
  uint local_dc;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_d8;
  SisdAlignmentEngine *local_d0;
  ulong local_c8;
  uint local_c0;
  uint local_bc;
  pointer local_b8;
  int32_t *local_b0;
  int32_t *local_a8;
  pointer local_a0;
  AlignmentType local_98;
  uint local_94;
  Graph *local_90;
  int32_t *local_88;
  ulong local_80;
  Node *local_78;
  long local_70;
  long local_68;
  int32_t *local_60;
  int32_t *local_58;
  int32_t *local_50;
  pointer local_48;
  pointer local_40;
  ulong local_38;
  
  AVar25 = (this->super_AlignmentEngine).type_;
  local_48 = (graph->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppNVar5 = (graph->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar18 = sequence_len + 1;
  local_c8 = (ulong)uVar18;
  uVar28 = 0x80000400;
  if (AVar25 == kSW) {
    uVar28 = 0;
  }
  if (ppNVar5 == local_48) {
    uVar21 = 0;
    uVar17 = 0;
  }
  else {
    pIVar6 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
    ;
    iVar23 = (int)(this->super_AlignmentEngine).g_;
    iVar31 = (int)(this->super_AlignmentEngine).e_;
    local_b0 = (int32_t *)(local_c8 * 4);
    uVar17 = 0;
    lVar1 = local_c8 * 4 + -4;
    local_68 = *(long *)&(pIVar6->node_id_to_rank).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    local_50 = pIVar6->H;
    local_58 = pIVar6->E + 1;
    local_b8 = (pointer)(local_50 + 1);
    local_70 = *(long *)&(pIVar6->sequence_profile).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl + 4;
    local_a8 = pIVar6->F + 1;
    local_38 = local_c8 - 2;
    uVar21 = 0;
    do {
      local_94 = uVar28;
      local_40 = ppNVar5;
      local_78 = *local_40;
      local_a0 = (local_78->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar7 = (local_78->inedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (local_a0 == ppEVar7) {
        uVar11 = 0;
      }
      else {
        uVar11 = (ulong)(*(int *)(local_68 + (ulong)(*local_a0)->tail->id * 4) + 1);
      }
      uVar28 = local_78->code;
      local_c0 = *(int *)(local_68 + (ulong)local_78->id * 4) + 1;
      local_80 = (ulong)local_c0;
      if (1 < uVar18) {
        lVar16 = uVar11 * (long)local_b0;
        lVar30 = 0;
        do {
          iVar32 = *(int *)((long)local_b8 + lVar30 + lVar16) + iVar23;
          iVar29 = *(int *)((long)local_a8 + lVar30 + lVar16) + iVar31;
          if (iVar29 < iVar32) {
            iVar29 = iVar32;
          }
          *(int *)((long)local_a8 + lVar30 + (long)local_b0 * local_80) = iVar29;
          *(int *)((long)local_b8 + lVar30 + (long)local_b0 * local_80) =
               *(int *)((long)local_b0 * (ulong)uVar28 + local_70 + lVar30) +
               *(int *)((long)local_b8 + lVar30 + lVar16 + -4);
          lVar30 = lVar30 + 4;
        } while (lVar1 != lVar30);
      }
      uVar11 = (long)ppEVar7 - (long)local_a0 >> 3;
      if (1 < uVar11) {
        uVar22 = 1;
        lVar16 = (long)local_b0 * local_80;
        cVar2 = (this->super_AlignmentEngine).g_;
        cVar3 = (this->super_AlignmentEngine).e_;
        do {
          if (1 < uVar18) {
            lVar33 = 0;
            lVar30 = (ulong)(*(int *)(local_68 + (ulong)local_a0[uVar22]->tail->id * 4) + 1) *
                     (long)local_b0;
            do {
              iVar29 = *(int *)((long)local_a8 + lVar33 + lVar16);
              iVar19 = *(int *)((long)local_b8 + lVar33 + lVar30) + (int)cVar2;
              iVar32 = *(int *)((long)local_a8 + lVar33 + lVar30) + (int)cVar3;
              if (iVar32 < iVar19) {
                iVar32 = iVar19;
              }
              if (iVar32 < iVar29) {
                iVar32 = iVar29;
              }
              *(int *)((long)local_a8 + lVar33 + lVar16) = iVar32;
              iVar29 = *(int *)((long)local_b8 + lVar33 + lVar16);
              iVar32 = *(int *)((ulong)uVar28 * (long)local_b0 + local_70 + lVar33) +
                       *(int *)((long)local_b8 + lVar33 + lVar30 + -4);
              if (iVar32 < iVar29) {
                iVar32 = iVar29;
              }
              *(int *)((long)local_b8 + lVar33 + lVar16) = iVar32;
              lVar33 = lVar33 + 4;
            } while (lVar1 != lVar33);
          }
          uVar22 = (ulong)((int)uVar22 + 1);
        } while (uVar22 < uVar11);
      }
      uVar28 = local_94;
      if (1 < uVar18) {
        uVar22 = 1;
        uVar11 = 0;
        lVar16 = (long)local_b0 * local_80;
        local_a0 = (pointer)(local_50 + local_80 * local_c8);
        uVar15 = *(uint *)local_a0;
        do {
          uVar15 = uVar15 + iVar23;
          uVar20 = *(int *)((long)local_58 + uVar11 * 4 + lVar16 + -4) + iVar31;
          if ((int)uVar20 < (int)uVar15) {
            uVar20 = uVar15;
          }
          *(uint *)((long)local_58 + uVar11 * 4 + lVar16) = uVar20;
          uVar4 = *(uint *)((long)local_a8 + uVar11 * 4 + lVar16);
          uVar15 = *(uint *)((long)local_b8 + uVar11 * 4 + lVar16);
          if ((int)uVar20 < (int)uVar4) {
            uVar20 = uVar4;
          }
          if ((int)uVar15 <= (int)uVar20) {
            uVar15 = uVar20;
          }
          *(uint *)((long)local_b8 + uVar11 * 4 + lVar16) = uVar15;
          if (AVar25 == kOV) {
            if (((local_78->outedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start ==
                 (local_78->outedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish) && ((int)uVar28 < (int)uVar15)) {
              uVar26 = (ulong)((int)uVar11 + 1);
LAB_00122a8e:
              uVar21 = (ulong)local_c0;
              uVar17 = uVar26;
              uVar28 = uVar15;
            }
          }
          else if (AVar25 == kNW) {
            if (((local_38 == uVar11) &&
                ((local_78->outedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start ==
                 (local_78->outedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish)) &&
               (uVar15 = *(uint *)((long)local_a0 + local_c8 * 4 + -4), uVar26 = local_c8 - 1,
               (int)uVar28 < (int)uVar15)) goto LAB_00122a8e;
          }
          else if (AVar25 == kSW) {
            uVar15 = ~((int)uVar15 >> 0x1f) & uVar15;
            *(uint *)((long)local_b8 + uVar11 * 4 + lVar16) = uVar15;
            if ((int)uVar28 < (int)uVar15) {
              uVar17 = uVar22 & 0xffffffff;
              uVar21 = (ulong)local_c0;
              uVar28 = uVar15;
            }
          }
          uVar22 = uVar22 + 1;
          uVar11 = uVar11 + 1;
        } while (local_c8 - 1 != uVar11);
      }
      ppNVar5 = local_40 + 1;
      local_98 = AVar25;
    } while (local_40 + 1 != local_48);
  }
  if ((int)uVar21 == 0 && (int)uVar17 == 0) {
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    return (Alignment *)
           (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)__return_storage_ptr__;
  }
  if (score != (int32_t *)0x0) {
    *score = uVar28;
  }
  uVar28 = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0 = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar11 = local_c8;
  local_d8 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)__return_storage_ptr__
  ;
  local_d0 = this;
  local_90 = graph;
  local_60 = score;
  do {
    uVar22 = local_c8;
    this_00 = local_d8;
    iVar23 = (int)uVar21;
    uVar18 = (uint)uVar17;
    uVar17 = uVar17 & 0xffffffff;
    if (AVar25 == kOV) {
      uVar15 = uVar18;
      if (iVar23 == 0) goto LAB_00123029;
joined_r0x00122b89:
      if (uVar15 == 0) goto LAB_00123029;
    }
    else {
      if (AVar25 != kNW) {
        if (AVar25 == kSW) {
          uVar15 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                   _M_head_impl)->H[uVar21 * uVar11 + uVar17];
          goto joined_r0x00122b89;
        }
LAB_00123029:
        ppVar12 = *(pointer *)__return_storage_ptr__;
        ppVar14 = *(pointer *)((long)__return_storage_ptr__ + 8) + -1;
        if (ppVar14 <= ppVar12 || ppVar12 == *(pointer *)((long)__return_storage_ptr__ + 8)) {
          return __return_storage_ptr__;
        }
        do {
          iVar23 = ppVar12->first;
          ppVar12->first = ppVar14->first;
          ppVar14->first = iVar23;
          iVar23 = ppVar12->second;
          ppVar12->second = ppVar14->second;
          ppVar14->second = iVar23;
          ppVar12 = ppVar12 + 1;
          ppVar14 = ppVar14 + -1;
        } while (ppVar12 < ppVar14);
        return __return_storage_ptr__;
      }
      if (iVar23 == 0 && uVar18 == 0) goto LAB_00123029;
    }
    pIVar6 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
    ;
    piVar8 = pIVar6->H;
    local_88 = piVar8 + uVar21 * uVar11;
    iVar31 = local_88[uVar17];
    if ((uVar18 == 0) || (iVar23 == 0)) {
LAB_00122c92:
      if (iVar23 == 0) {
LAB_00122c9e:
        uVar15 = local_f0;
        if (uVar18 == 0) {
          uVar26 = (ulong)uVar28;
          goto LAB_00122d41;
        }
        bVar34 = iVar31 == (int)(local_d0->super_AlignmentEngine).e_ +
                           pIVar6->E[uVar21 * uVar11 + (uVar17 - 1)];
        if ((!bVar34) &&
           (iVar31 != (int)(local_d0->super_AlignmentEngine).g_ + local_88[uVar17 - 1])) {
          uVar27 = (ulong)uVar28;
          goto LAB_00122e66;
        }
        bVar35 = false;
        local_f0 = uVar18 - 1;
      }
      else {
LAB_00122cfb:
        pNVar9 = (local_90->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar23 - 1];
        local_b8 = (pNVar9->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar7 = *(pointer *)
                   ((long)&(pNVar9->inedges).
                           super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                           ._M_impl + 8);
        if (local_b8 == ppEVar7) {
          uVar27 = 0;
        }
        else {
          uVar27 = (ulong)(*(int *)(*(long *)&(pIVar6->node_id_to_rank).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                   + (ulong)(*local_b8)->tail->id * 4) + 1);
        }
        iVar29 = (int)(local_d0->super_AlignmentEngine).e_;
        if (iVar31 == pIVar6->F[uVar27 * local_c8 + uVar17] + iVar29) {
          bVar35 = true;
          bVar34 = false;
          uVar21 = uVar27;
          local_f0 = uVar18;
        }
        else {
          iVar32 = (int)(local_d0->super_AlignmentEngine).g_;
          uVar15 = uVar18;
          if (iVar31 != piVar8[uVar27 * local_c8 + uVar17] + iVar32) {
            uVar27 = (long)ppEVar7 - (long)local_b8 >> 3;
            if (1 < uVar27) {
              local_a8 = *(int32_t **)
                          &(pIVar6->node_id_to_rank).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
              local_b0 = piVar8 + uVar17;
              local_a0 = (pointer)(pIVar6->F + uVar17);
              uVar26 = 1;
              uVar24 = 2;
              do {
                uVar26 = (ulong)(local_a8[local_b8[uVar26]->tail->id] + 1);
                bVar35 = iVar31 == *(int *)((long)local_a0 + uVar26 * local_c8 * 4) + iVar29;
                if ((bVar35) || (iVar31 == local_b0[uVar26 * local_c8] + iVar32)) goto LAB_00122d44;
                bVar35 = uVar24 < uVar27;
                uVar26 = uVar24;
                uVar24 = (ulong)((int)uVar24 + 1);
              } while (bVar35);
            }
            goto LAB_00122c9e;
          }
LAB_00122e66:
          local_f0 = uVar15;
          bVar35 = false;
          bVar34 = false;
          uVar21 = uVar27;
        }
      }
    }
    else {
      pNVar9 = (local_90->rank_to_node_).
               super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl
               .super__Vector_impl_data._M_start[iVar23 - 1];
      ppEVar7 = (pNVar9->inedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppEVar10 = *(pointer *)
                  ((long)&(pNVar9->inedges).
                          super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                          ._M_impl + 8);
      if (ppEVar7 == ppEVar10) {
        uVar26 = 0;
      }
      else {
        uVar26 = (ulong)(*(int *)(*(long *)&(pIVar6->node_id_to_rank).
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                 + (ulong)(*ppEVar7)->tail->id * 4) + 1);
      }
      uVar15 = uVar18 - 1;
      iVar29 = *(int *)(pNVar9->code * local_c8 * 4 +
                        *(long *)&(pIVar6->sequence_profile).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl + uVar17 * 4
                       );
      if (iVar31 != piVar8[uVar26 * local_c8 + (ulong)uVar15] + iVar29) {
        uVar26 = (long)ppEVar10 - (long)ppEVar7 >> 3;
        if (1 < uVar26) {
          uVar27 = 1;
          uVar24 = 2;
          do {
            uVar27 = (ulong)(*(int *)(*(long *)&(pIVar6->node_id_to_rank).
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     + (ulong)ppEVar7[uVar27]->tail->id * 4) + 1);
            if (iVar31 == piVar8[(ulong)uVar15 + uVar27 * local_c8] + iVar29) goto LAB_00122e66;
            bVar35 = uVar24 < uVar26;
            uVar27 = uVar24;
            uVar24 = (ulong)((int)uVar24 + 1);
          } while (bVar35);
          goto LAB_00122c92;
        }
        goto LAB_00122cfb;
      }
LAB_00122d41:
      local_f0 = uVar15;
      bVar35 = false;
      uVar15 = local_f0;
LAB_00122d44:
      local_f0 = uVar15;
      bVar34 = false;
      uVar21 = uVar26;
    }
    local_dc = 0xffffffff;
    if (iVar23 != (int)uVar21) {
      local_dc = (local_90->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar23 - 1]->id;
    }
    local_bc = uVar18 - 1;
    if (uVar18 == local_f0) {
      local_bc = 0xffffffff;
    }
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<unsigned_int,unsigned_int>(local_d8,&local_dc,&local_bc);
    this = local_d0;
    if (bVar34) {
      uVar17 = (ulong)local_f0;
      do {
        uVar28 = (int)uVar17 - 1;
        uVar17 = (ulong)uVar28;
        local_dc = 0xffffffff;
        local_bc = uVar28;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<int,unsigned_int>(this_00,(int *)&local_dc,&local_bc);
        piVar8 = ((this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                 _M_head_impl)->E;
      } while ((int)(this->super_AlignmentEngine).e_ + piVar8[uVar21 * uVar22 + (ulong)uVar28] ==
               piVar8[uVar21 * uVar22 + (ulong)uVar28 + 1]);
    }
    else {
      if (bVar35) {
        uVar17 = (ulong)local_f0;
        do {
          this_00 = local_d8;
          pNVar9 = (local_90->rank_to_node_).
                   super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[(int)uVar21 - 1];
          ppEVar7 = (pNVar9->inedges).
                    super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppEVar10 = *(pointer *)
                      ((long)&(pNVar9->inedges).
                              super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                              ._M_impl + 8);
          if (ppEVar7 == ppEVar10) {
            bVar35 = false;
            uVar21 = 0;
          }
          else {
            pIVar6 = (local_d0->pimpl_)._M_t.
                     super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                     .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                     _M_head_impl;
            iVar23 = pIVar6->F[uVar17 + uVar21 * uVar22];
            uVar11 = uVar22;
            do {
              ppEVar13 = ppEVar7 + 1;
              uVar21 = (ulong)(*(int *)(*(long *)&(pIVar6->node_id_to_rank).
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       + (ulong)(*ppEVar7)->tail->id * 4) + 1);
              bVar35 = iVar23 == pIVar6->H[uVar17 + uVar21 * uVar11] +
                                 (int)(local_d0->super_AlignmentEngine).g_;
              uVar22 = local_c8;
              if ((bVar35) ||
                 (iVar23 == pIVar6->F[uVar17 + uVar21 * uVar11] +
                            (int)(local_d0->super_AlignmentEngine).e_)) break;
              uVar11 = local_c8;
              uVar21 = 0;
              ppEVar7 = ppEVar13;
            } while (ppEVar13 != ppEVar10);
          }
          local_dc = 0xffffffff;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<unsigned_int&,int>(local_d8,&pNVar9->id,(int *)&local_dc);
        } while (!(bool)(bVar35 | (int)uVar21 == 0));
      }
      uVar17 = (ulong)local_f0;
      this = local_d0;
    }
    AVar25 = (this->super_AlignmentEngine).type_;
    uVar28 = (uint)uVar21;
    uVar11 = uVar22;
    __return_storage_ptr__ = (Alignment *)this_00;
  } while( true );
}

Assistant:

Alignment SisdAlignmentEngine::Affine(
    std::uint32_t sequence_len,
    const Graph& graph,
    std::int32_t* score) noexcept {
  std::uint64_t matrix_width = sequence_len + 1;
  const auto& rank_to_node = graph.rank_to_node();

  std::int32_t max_score = type_ == AlignmentType::kSW ? 0 : kNegativeInfinity;
  std::uint32_t max_i = 0;
  std::uint32_t max_j = 0;
  auto update_max_score = [&max_score, &max_i, &max_j] (
      std::int32_t* H_row,
      std::uint32_t i,
      std::uint32_t j) -> void {
    if (max_score < H_row[j]) {
      max_score = H_row[j];
      max_i = i;
      max_j = j;
    }
    return;
  };

  // alignment
  for (const auto& it : rank_to_node) {
    const auto& char_profile =
        &(pimpl_->sequence_profile[it->code * matrix_width]);

    std::uint32_t i = pimpl_->node_id_to_rank[it->id] + 1;
    std::uint32_t pred_i = it->inedges.empty() ? 0 :
        pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

    std::int32_t* H_row = &(pimpl_->H[i * matrix_width]);
    std::int32_t* H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

    std::int32_t* F_row = &(pimpl_->F[i * matrix_width]);
    std::int32_t* F_pred_row = &(pimpl_->F[pred_i * matrix_width]);

    // update F and H
    for (std::uint64_t j = 1; j < matrix_width; ++j) {
      F_row[j] = std::max(
          H_pred_row[j] + g_,
          F_pred_row[j] + e_);
      H_row[j] = H_pred_row[j - 1] + char_profile[j];
    }
    // check other predeccessors
    for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
      pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

      H_pred_row = &(pimpl_->H[pred_i * matrix_width]);
      F_pred_row = &(pimpl_->F[pred_i * matrix_width]);

      for (std::uint64_t j = 1; j < matrix_width; ++j) {
        F_row[j] = std::max(
            F_row[j],
            std::max(
                H_pred_row[j] + g_,
                F_pred_row[j] + e_));
        H_row[j] = std::max(
            H_row[j],
            H_pred_row[j - 1] + char_profile[j]);
      }
    }

    // update E and H
    std::int32_t* E_row = &(pimpl_->E[i * matrix_width]);
    for (std::uint64_t j = 1; j < matrix_width; ++j) {
      E_row[j] = std::max(H_row[j - 1] + g_, E_row[j - 1] + e_);
      H_row[j] = std::max(H_row[j], std::max(F_row[j], E_row[j]));

      if (type_ == AlignmentType::kSW) {
        H_row[j] = std::max(H_row[j], 0);
        update_max_score(H_row, i, j);
      } else if (type_ == AlignmentType::kNW &&
          (it->outedges.empty() && j == matrix_width - 1)) {
        update_max_score(H_row, i, j);
      } else if (type_ == AlignmentType::kOV && (it->outedges.empty())) {
        update_max_score(H_row, i, j);
      }
    }
  }

  if (max_i == 0 && max_j == 0) {
    return Alignment();
  }
  if (score) {
    *score = max_score;
  }

  // backtrack
  Alignment alignment;
  std::uint32_t i = max_i;
  std::uint32_t j = max_j;

  auto sw_condition = [this, &i, &j, &matrix_width] () -> bool {
    return (pimpl_->H[i * matrix_width + j] == 0) ? false : true;
  };
  auto nw_condition = [&i, &j] () -> bool {
    return (i == 0 && j == 0) ? false : true;
  };
  auto ov_condition = [&i, &j] () -> bool {
    return (i == 0 || j == 0) ? false : true;
  };

  std::uint32_t prev_i = 0;
  std::uint32_t prev_j = 0;

  while ((type_ == AlignmentType::kSW && sw_condition()) ||
         (type_ == AlignmentType::kNW && nw_condition()) ||
         (type_ == AlignmentType::kOV && ov_condition())) {
    auto H_ij = pimpl_->H[i * matrix_width + j];
    bool predecessor_found = false, extend_left = false, extend_up = false;

    if (i != 0 && j != 0) {
      const auto& it = rank_to_node[i - 1];
      std::int32_t match_cost =
          pimpl_->sequence_profile[it->code * matrix_width + j];

      std::uint32_t pred_i = it->inedges.empty() ?
          0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

      if (H_ij == pimpl_->H[pred_i * matrix_width + (j - 1)] + match_cost) {
        prev_i = pred_i;
        prev_j = j - 1;
        predecessor_found = true;
      } else {
        for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
          pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

          if (H_ij == pimpl_->H[pred_i * matrix_width + (j - 1)] + match_cost) {
            prev_i = pred_i;
            prev_j = j - 1;
            predecessor_found = true;
            break;
          }
        }
      }
    }

    if (!predecessor_found && i != 0) {
      const auto& it = rank_to_node[i - 1];

      std::uint32_t pred_i = it->inedges.empty() ?
          0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

      if ((extend_up = H_ij == pimpl_->F[pred_i * matrix_width + j] + e_) ||
                       H_ij == pimpl_->H[pred_i * matrix_width + j] + g_) {
        prev_i = pred_i;
        prev_j = j;
        predecessor_found = true;
      } else {
        for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
          pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

          if ((extend_up = H_ij == pimpl_->F[pred_i * matrix_width + j] + e_) ||
                           H_ij == pimpl_->H[pred_i * matrix_width + j] + g_) {
            prev_i = pred_i;
            prev_j = j;
            predecessor_found = true;
            break;
          }
        }
      }
    }

    if (!predecessor_found && j != 0) {
      if ((extend_left = H_ij == pimpl_->E[i * matrix_width + j - 1] + e_) ||
                         H_ij == pimpl_->H[i * matrix_width + j - 1] + g_) {
        prev_i = i;
        prev_j = j - 1;
        predecessor_found = true;
      }
    }

    alignment.emplace_back(
        i == prev_i ? -1 : rank_to_node[i - 1]->id,
        j == prev_j ? -1 : j - 1);

    i = prev_i;
    j = prev_j;

    if (extend_left) {
      while (true) {
        alignment.emplace_back(-1, j - 1);
        --j;
        if (pimpl_->E[i * matrix_width + j] + e_ !=
            pimpl_->E[i * matrix_width + j + 1]) {
          break;
        }
      }
    } else if (extend_up) {
      while (true) {
        bool stop = false;
        prev_i = 0;
        for (const auto& it : rank_to_node[i - 1]->inedges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;

          if ((stop = pimpl_->F[i * matrix_width + j] == pimpl_->H[pred_i * matrix_width + j] + g_) ||  // NOLINT
                      pimpl_->F[i * matrix_width + j] == pimpl_->F[pred_i * matrix_width + j] + e_) {  // NOLINT
            prev_i = pred_i;
            break;
          }
        }

        alignment.emplace_back(rank_to_node[i - 1]->id, -1);
        i = prev_i;
        if (stop || i == 0) {
          break;
        }
      }
    }
  }

  std::reverse(alignment.begin(), alignment.end());
  return alignment;
}